

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluator.cxx
# Opt level: O0

string * __thiscall
GeneratorExpressionContent::EvaluateParameters
          (string *__return_storage_ptr__,GeneratorExpressionContent *this,
          cmGeneratorExpressionNode *node,string *identifier,cmGeneratorExpressionContext *context,
          cmGeneratorExpressionDAGChecker *dagChecker,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  reference this_00;
  reference ppcVar4;
  size_type sVar5;
  ostream *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  string local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  string local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  undefined1 local_330 [8];
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  int local_f4;
  string local_f0 [32];
  cmGeneratorExpressionEvaluator *local_d0;
  cmGeneratorExpressionEvaluator *pExprEval;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *__range2;
  string parameter;
  string local_78;
  uint local_58;
  byte local_51;
  int counter;
  bool acceptsArbitraryContent;
  const_iterator pend;
  const_iterator pit;
  int numExpected;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  cmGeneratorExpressionContext *context_local;
  string *identifier_local;
  cmGeneratorExpressionNode *node_local;
  GeneratorExpressionContent *this_local;
  
  uVar2 = (*node->_vptr_cmGeneratorExpressionNode[5])();
  pend = std::
         vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
         ::begin(&this->ParamChildren);
  _counter = std::
             vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
             ::end(&this->ParamChildren);
  iVar3 = (*node->_vptr_cmGeneratorExpressionNode[4])();
  local_51 = (byte)iVar3 & 1;
  local_58 = 1;
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&pend,(__normal_iterator<const_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
                              *)&counter);
    if (!bVar1) {
      if (((int)uVar2 < 1) ||
         (sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(parameters), uVar2 == sVar5)) {
        if ((uVar2 == 0xffffffff) &&
           (bVar1 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty(parameters), bVar1)) {
          GetOriginalExpression_abi_cxx11_(&local_3d0,this);
          std::operator+(&local_410,"$<",identifier);
          std::operator+(&local_3f0,&local_410,"> expression requires at least one parameter.");
          reportError(context,&local_3d0,&local_3f0);
          std::__cxx11::string::~string((string *)&local_3f0);
          std::__cxx11::string::~string((string *)&local_410);
          std::__cxx11::string::~string((string *)&local_3d0);
        }
        else if ((uVar2 == 0xfffffffe) &&
                (sVar5 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size(parameters), sVar5 < 2)) {
          GetOriginalExpression_abi_cxx11_(&local_430,this);
          std::operator+(&local_470,"$<",identifier);
          std::operator+(&local_450,&local_470,"> expression requires at least two parameters.");
          reportError(context,&local_430,&local_450);
          std::__cxx11::string::~string((string *)&local_450);
          std::__cxx11::string::~string((string *)&local_470);
          std::__cxx11::string::~string((string *)&local_430);
        }
        else if ((uVar2 == 0xfffffffc) &&
                (sVar5 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size(parameters), 1 < sVar5)) {
          GetOriginalExpression_abi_cxx11_(&local_490,this);
          std::operator+(&local_4d0,"$<",identifier);
          std::operator+(&local_4b0,&local_4d0,"> expression requires one or zero parameters.");
          reportError(context,&local_490,&local_4b0);
          std::__cxx11::string::~string((string *)&local_4b0);
          std::__cxx11::string::~string((string *)&local_4d0);
          std::__cxx11::string::~string((string *)&local_490);
        }
        std::__cxx11::string::string((string *)__return_storage_ptr__);
      }
      else {
        if (uVar2 == 0) {
          GetOriginalExpression_abi_cxx11_(&local_118,this);
          std::operator+(&local_158,"$<",identifier);
          std::operator+(&local_138,&local_158,"> expression requires no parameters.");
          reportError(context,&local_118,&local_138);
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_118);
        }
        else if (uVar2 == 1) {
          GetOriginalExpression_abi_cxx11_(&local_178,this);
          std::operator+(&local_1b8,"$<",identifier);
          std::operator+(&local_198,&local_1b8,"> expression requires exactly one parameter.");
          reportError(context,&local_178,&local_198);
          std::__cxx11::string::~string((string *)&local_198);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_178);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
          std::operator+(&local_370,"$<",identifier);
          std::operator+(&local_350,&local_370,"> expression requires ");
          poVar6 = std::operator<<((ostream *)local_330,(string *)&local_350);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar2);
          poVar6 = std::operator<<(poVar6," comma separated parameters, but got ");
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(parameters);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar5);
          std::operator<<(poVar6," instead.");
          std::__cxx11::string::~string((string *)&local_350);
          std::__cxx11::string::~string((string *)&local_370);
          GetOriginalExpression_abi_cxx11_(&local_390,this);
          std::__cxx11::ostringstream::str();
          reportError(context,&local_390,&local_3b0);
          std::__cxx11::string::~string((string *)&local_3b0);
          std::__cxx11::string::~string((string *)&local_390);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
        }
        std::__cxx11::string::string((string *)__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    if (((local_51 & 1) != 0) && (local_58 == uVar2)) {
      ProcessArbitraryContent(&local_78,this,node,identifier,context,dagChecker,pend);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(parameters,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&__range2);
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
              ::operator*(&pend);
    __end2 = std::
             vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
             ::begin(this_00);
    pExprEval = (cmGeneratorExpressionEvaluator *)
                std::
                vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
                                       *)&pExprEval), bVar1) {
      ppcVar4 = __gnu_cxx::
                __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
                ::operator*(&__end2);
      local_d0 = *ppcVar4;
      (*local_d0->_vptr_cmGeneratorExpressionEvaluator[3])(local_f0,local_d0,context,dagChecker);
      std::__cxx11::string::operator+=((string *)&__range2,local_f0);
      std::__cxx11::string::~string(local_f0);
      if ((context->HadError & 1U) != 0) {
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        local_f4 = 1;
        goto LAB_006846b5;
      }
      __gnu_cxx::
      __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(parameters,(value_type *)&__range2);
    local_f4 = 0;
LAB_006846b5:
    std::__cxx11::string::~string((string *)&__range2);
    if (local_f4 != 0) {
      return __return_storage_ptr__;
    }
    __gnu_cxx::
    __normal_iterator<const_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
    ::operator++(&pend);
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

std::string GeneratorExpressionContent::EvaluateParameters(
  const cmGeneratorExpressionNode* node, const std::string& identifier,
  cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker,
  std::vector<std::string>& parameters) const
{
  const int numExpected = node->NumExpectedParameters();
  {
    std::vector<std::vector<cmGeneratorExpressionEvaluator*>>::const_iterator
      pit = this->ParamChildren.begin();
    const std::vector<
      std::vector<cmGeneratorExpressionEvaluator*>>::const_iterator pend =
      this->ParamChildren.end();
    const bool acceptsArbitraryContent =
      node->AcceptsArbitraryContentParameter();
    int counter = 1;
    for (; pit != pend; ++pit, ++counter) {
      if (acceptsArbitraryContent && counter == numExpected) {
        parameters.push_back(this->ProcessArbitraryContent(
          node, identifier, context, dagChecker, pit));
        return std::string();
      }
      std::string parameter;
      for (cmGeneratorExpressionEvaluator* pExprEval : *pit) {
        parameter += pExprEval->Evaluate(context, dagChecker);
        if (context->HadError) {
          return std::string();
        }
      }
      parameters.push_back(std::move(parameter));
    }
  }

  if ((numExpected > cmGeneratorExpressionNode::DynamicParameters &&
       static_cast<unsigned int>(numExpected) != parameters.size())) {
    if (numExpected == 0) {
      reportError(context, this->GetOriginalExpression(),
                  "$<" + identifier + "> expression requires no parameters.");
    } else if (numExpected == 1) {
      reportError(context, this->GetOriginalExpression(),
                  "$<" + identifier +
                    "> expression requires "
                    "exactly one parameter.");
    } else {
      std::ostringstream e;
      e << "$<" + identifier + "> expression requires " << numExpected
        << " comma separated parameters, but got " << parameters.size()
        << " instead.";
      reportError(context, this->GetOriginalExpression(), e.str());
    }
    return std::string();
  }

  if (numExpected == cmGeneratorExpressionNode::OneOrMoreParameters &&
      parameters.empty()) {
    reportError(context, this->GetOriginalExpression(),
                "$<" + identifier +
                  "> expression requires at least one parameter.");
  } else if (numExpected == cmGeneratorExpressionNode::TwoOrMoreParameters &&
             parameters.size() < 2) {
    reportError(context, this->GetOriginalExpression(),
                "$<" + identifier +
                  "> expression requires at least two parameters.");
  } else if (numExpected == cmGeneratorExpressionNode::OneOrZeroParameters &&
             parameters.size() > 1) {
    reportError(context, this->GetOriginalExpression(),
                "$<" + identifier +
                  "> expression requires one or zero parameters.");
  }
  return std::string();
}